

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool testing::Test::HasFatalFailure(void)

{
  long lVar1;
  bool bVar2;
  UnitTestImpl *pUVar3;
  TestResult *this;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pUVar3 = internal::GetUnitTestImpl();
  if (pUVar3->current_test_info_ == (TestInfo *)0x0) {
    if (pUVar3->current_test_case_ == (TestCase *)0x0) {
      this = &pUVar3->ad_hoc_test_result_;
    }
    else {
      this = &pUVar3->current_test_case_->ad_hoc_test_result_;
    }
  }
  else {
    this = &pUVar3->current_test_info_->result_;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    bVar2 = TestResult::HasFatalFailure(this);
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool Test::HasFatalFailure() {
  return internal::GetUnitTestImpl()->current_test_result()->HasFatalFailure();
}